

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

VkResult fill_out_count_pointer_pair<VkSurfaceFormatKHR>
                   (vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *data_vec,
                   uint32_t *pCount,VkSurfaceFormatKHR *pData)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_38;
  size_t i;
  uint32_t amount_to_write;
  uint32_t amount_written;
  VkSurfaceFormatKHR *pData_local;
  uint32_t *pCount_local;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *data_vec_local;
  
  if (pCount == (uint32_t *)0x0) {
    data_vec_local._4_4_ = VK_ERROR_OUT_OF_HOST_MEMORY;
  }
  else if (pData == (VkSurfaceFormatKHR *)0x0) {
    if (pCount != (uint32_t *)0x0) {
      sVar2 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::size(data_vec);
      *pCount = (uint32_t)sVar2;
    }
    data_vec_local._4_4_ = VK_SUCCESS;
  }
  else {
    i._4_4_ = 0;
    sVar2 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::size(data_vec);
    i._0_4_ = (uint32_t)sVar2;
    uVar1 = *pCount;
    sVar2 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::size(data_vec);
    if (uVar1 < sVar2) {
      i._0_4_ = *pCount;
    }
    for (local_38 = 0; local_38 < (uint32_t)i; local_38 = local_38 + 1) {
      pvVar3 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::operator[]
                         (data_vec,local_38);
      pData[local_38] = *pvVar3;
      i._4_4_ = i._4_4_ + 1;
    }
    uVar1 = *pCount;
    sVar2 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::size(data_vec);
    if (uVar1 < sVar2) {
      *pCount = i._4_4_;
      data_vec_local._4_4_ = VK_INCOMPLETE;
    }
    else {
      *pCount = i._4_4_;
      data_vec_local._4_4_ = VK_SUCCESS;
    }
  }
  return data_vec_local._4_4_;
}

Assistant:

VkResult fill_out_count_pointer_pair(std::vector<T> const& data_vec, uint32_t* pCount, T* pData) {
    if (pCount == nullptr) {
        return VK_ERROR_OUT_OF_HOST_MEMORY;
    }
    if (pData == nullptr) {
        if (pCount) *pCount = static_cast<uint32_t>(data_vec.size());
        return VK_SUCCESS;
    } else {
        uint32_t amount_written = 0;
        uint32_t amount_to_write = static_cast<uint32_t>(data_vec.size());
        if (*pCount < data_vec.size()) {
            amount_to_write = *pCount;
        }
        for (size_t i = 0; i < amount_to_write; i++) {
            pData[i] = data_vec[i];
            amount_written++;
        }
        if (*pCount < data_vec.size()) {
            *pCount = amount_written;
            return VK_INCOMPLETE;
        }
        *pCount = amount_written;
        return VK_SUCCESS;
    }
}